

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O0

Vec_Ptr_t * Saig_ManBmcSupergate(Aig_Man_t *p,int iPo)

{
  int iVar1;
  Vec_Ptr_t *vSuper_00;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vSuper;
  int iPo_local;
  Aig_Man_t *p_local;
  
  vSuper_00 = Vec_PtrAlloc(10);
  pAVar2 = Aig_ManCo(p,iPo);
  pAVar2 = Aig_ObjChild0(pAVar2);
  iVar1 = Aig_IsComplement(pAVar2);
  if (iVar1 == 0) {
    Vec_PtrPush(vSuper_00,pAVar2);
  }
  else {
    pAVar2 = Aig_Regular(pAVar2);
    iVar1 = Aig_ObjIsNode(pAVar2);
    if (iVar1 == 0) {
      Vec_PtrPush(vSuper_00,pAVar2);
    }
    else {
      pObj_00 = Aig_ObjChild0(pAVar2);
      Saig_ManBmcSupergate_rec(pObj_00,vSuper_00);
      pAVar2 = Aig_ObjChild1(pAVar2);
      Saig_ManBmcSupergate_rec(pAVar2,vSuper_00);
    }
  }
  return vSuper_00;
}

Assistant:

Vec_Ptr_t * Saig_ManBmcSupergate( Aig_Man_t * p, int iPo )
{
    Vec_Ptr_t * vSuper;
    Aig_Obj_t * pObj;
    vSuper = Vec_PtrAlloc( 10 );
    pObj = Aig_ManCo( p, iPo );
    pObj = Aig_ObjChild0( pObj );
    if ( !Aig_IsComplement(pObj) )
    {
        Vec_PtrPush( vSuper, pObj );
        return vSuper;
    }
    pObj = Aig_Regular( pObj );
    if ( !Aig_ObjIsNode(pObj) )
    {
        Vec_PtrPush( vSuper, pObj );
        return vSuper;
    }
    Saig_ManBmcSupergate_rec( Aig_ObjChild0(pObj), vSuper );
    Saig_ManBmcSupergate_rec( Aig_ObjChild1(pObj), vSuper );
    return vSuper;
}